

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::class_<ImGuiTableBgTarget_>::init_instance(instance *inst,void *holder_ptr)

{
  bool bVar1;
  type_info *find_type;
  void **ppvVar2;
  ImGuiTableBgTarget_ **ppIVar3;
  type_index local_40;
  undefined1 local_38 [8];
  value_and_holder v_h;
  void *holder_ptr_local;
  instance *inst_local;
  
  v_h.vh = (void **)holder_ptr;
  std::type_index::type_index(&local_40,(type_info *)&ImGuiTableBgTarget_::typeinfo);
  find_type = pybind11::detail::get_type_info(&local_40,false);
  pybind11::detail::instance::get_value_and_holder((value_and_holder *)local_38,inst,find_type,true)
  ;
  bVar1 = pybind11::detail::value_and_holder::instance_registered((value_and_holder *)local_38);
  if (!bVar1) {
    ppvVar2 = pybind11::detail::value_and_holder::value_ptr<void>((value_and_holder *)local_38);
    pybind11::detail::register_instance(inst,*ppvVar2,(type_info *)v_h.index);
    pybind11::detail::value_and_holder::set_instance_registered((value_and_holder *)local_38,true);
  }
  ppvVar2 = v_h.vh;
  ppIVar3 = pybind11::detail::value_and_holder::value_ptr<ImGuiTableBgTarget_>
                      ((value_and_holder *)local_38);
  init_holder(inst,(value_and_holder *)local_38,(holder_type *)ppvVar2,*ppIVar3);
  return;
}

Assistant:

static void init_instance(detail::instance *inst, const void *holder_ptr) {
        auto v_h = inst->get_value_and_holder(detail::get_type_info(typeid(type)));
        if (!v_h.instance_registered()) {
            register_instance(inst, v_h.value_ptr(), v_h.type);
            v_h.set_instance_registered();
        }
        init_holder(inst, v_h, (const holder_type *) holder_ptr, v_h.value_ptr<type>());
    }